

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QMimeData * __thiscall QTableWidget::mimeData(QTableWidget *this,QList<QTableWidgetItem_*> *items)

{
  QList<QModelIndex> *this_00;
  long lVar1;
  QTableWidgetItem **ppQVar2;
  undefined8 uVar3;
  long lVar4;
  QList_conflict *pQVar5;
  QMimeData *pQVar6;
  char *__s;
  long lVar7;
  long in_FS_OFFSET;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  lVar4 = QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  if (*(long *)(lVar4 + 0x70) == 0) {
    this_00 = (QList<QModelIndex> *)(lVar4 + 0x60);
    QList<QModelIndex>::reserve(this_00,(items->d).size);
    lVar1 = (items->d).size;
    if (lVar1 != 0) {
      ppQVar2 = (items->d).ptr;
      lVar7 = 0;
      do {
        uVar3 = *(undefined8 *)((long)ppQVar2 + lVar7);
        __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
        QTableModel::index((QTableModel *)&stack0xffffffffffffffb0,__s,(int)uVar3);
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                  ((QMovableArrayOps<QModelIndex> *)this_00,*(qsizetype *)(lVar4 + 0x70),
                   (QModelIndex *)&stack0xffffffffffffffb0);
        QList<QModelIndex>::end(this_00);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
    }
    pQVar5 = (QList_conflict *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    pQVar6 = (QMimeData *)QAbstractItemModel::mimeData(pQVar5);
    QList<QModelIndex>::clear(this_00);
    if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar6;
    }
  }
  else {
    pQVar5 = (QList_conflict *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar6 = (QMimeData *)QAbstractItemModel::mimeData(pQVar5);
      return pQVar6;
    }
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTableWidget::mimeData(const QList<QTableWidgetItem *> &items) const
{
    Q_D(const QTableWidget);

    QModelIndexList &cachedIndexes = d->tableModel()->cachedIndexes;

    // if non empty, it's called from the model's own mimeData
    if (cachedIndexes.isEmpty()) {
        cachedIndexes.reserve(items.size());
        for (QTableWidgetItem *item : items)
            cachedIndexes << indexFromItem(item);

        QMimeData *result = d->tableModel()->internalMimeData();

        cachedIndexes.clear();
        return result;
    }

    return d->tableModel()->internalMimeData();
}